

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<MyPairIndex>::swap
          (cbtAlignedObjectArray<MyPairIndex> *this,int index0,int index1)

{
  int iVar1;
  MyPairIndex *pMVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MyPairIndex temp;
  
  pMVar2 = this->m_data;
  iVar1 = pMVar2[index0].m_uidA1;
  iVar4 = pMVar2[index0].m_orgIndex;
  iVar5 = pMVar2[index0].m_uidA0;
  iVar3 = pMVar2[index1].m_uidA0;
  pMVar2[index0].m_orgIndex = pMVar2[index1].m_orgIndex;
  pMVar2[index0].m_uidA0 = iVar3;
  pMVar2[index0].m_uidA1 = pMVar2[index1].m_uidA1;
  pMVar2 = this->m_data;
  pMVar2[index1].m_uidA1 = iVar1;
  pMVar2 = pMVar2 + index1;
  pMVar2->m_orgIndex = iVar4;
  pMVar2->m_uidA0 = iVar5;
  return;
}

Assistant:

void swap(int index0, int index1)
	{
#ifdef BT_USE_MEMCPY
		char temp[sizeof(T)];
		memcpy(temp, &m_data[index0], sizeof(T));
		memcpy(&m_data[index0], &m_data[index1], sizeof(T));
		memcpy(&m_data[index1], temp, sizeof(T));
#else
		T temp = m_data[index0];
		m_data[index0] = m_data[index1];
		m_data[index1] = temp;
#endif  //BT_USE_PLACEMENT_NEW
	}